

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O2

void __thiscall
btSimulationIslandManager::updateActivationState
          (btSimulationIslandManager *this,btCollisionWorld *colWorld,btDispatcher *dispatcher)

{
  uint uVar1;
  btCollisionObject *pbVar2;
  ulong uVar3;
  ulong uVar4;
  int N;
  btDispatcher *pbVar5;
  
  uVar1 = (colWorld->m_collisionObjects).m_size;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  pbVar5 = (btDispatcher *)0x0;
  for (; N = (int)pbVar5, uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pbVar2 = (colWorld->m_collisionObjects).m_data[uVar4];
    if ((pbVar2->m_collisionFlags & 3) == 0) {
      pbVar2->m_islandTag1 = N;
      pbVar5 = (btDispatcher *)(ulong)(N + 1);
    }
    pbVar2->m_companionId = -1;
    pbVar2->m_hitFraction = 1.0;
  }
  btUnionFind::reset(&this->m_unionFind,N);
  findUnions(this,pbVar5,colWorld);
  return;
}

Assistant:

void   btSimulationIslandManager::updateActivationState(btCollisionWorld* colWorld,btDispatcher* dispatcher)
{

	// put the index into m_controllers into m_tag   
	int index = 0;
	{

		int i;
		for (i=0;i<colWorld->getCollisionObjectArray().size(); i++)
		{
			btCollisionObject*   collisionObject= colWorld->getCollisionObjectArray()[i];
			//Adding filtering here
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag(index++);
			}
			collisionObject->setCompanionId(-1);
			collisionObject->setHitFraction(btScalar(1.));
		}
	}
	// do the union find

	initUnionFind( index );

	findUnions(dispatcher,colWorld);
}